

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

pair<const_slang::ast::ClassType_*,_bool>
slang::ast::resolveNewClassTarget
          (NameSyntax *nameSyntax,ASTContext *context,Type **assignmentTarget,SourceRange range)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  bool bVar1;
  Compilation *this;
  Type *pTVar2;
  undefined8 in_RCX;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar3;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  pair<const_slang::ast::ClassType_*,_bool> pVar4;
  NameSyntax *className;
  Type *base;
  type_conflict2 *_;
  type *ct;
  ScopedNameSyntax *scoped;
  ClassType *classType;
  bool isSuperClass;
  ASTContext *in_stack_00000208;
  NameSyntax *in_stack_00000210;
  _Optional_payload_base<slang::DiagCode> in_stack_0000021a;
  ClassType *in_stack_fffffffffffffe50;
  bool local_199;
  ASTContext *in_stack_fffffffffffffe68;
  SourceLocation in_stack_fffffffffffffe70;
  SourceLocation in_stack_fffffffffffffe78;
  Scope *in_stack_fffffffffffffe80;
  DiagCode DVar5;
  undefined2 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe92;
  undefined4 uVar6;
  undefined1 in_stack_fffffffffffffe96;
  bool in_stack_fffffffffffffe97;
  void *in_stack_fffffffffffffe98;
  SyntaxNode *in_stack_fffffffffffffea0;
  bool local_139;
  void *local_138;
  undefined4 local_130;
  undefined2 local_12c;
  undefined4 local_126;
  undefined2 local_122;
  NameSyntax *local_120;
  bool local_111;
  void *local_110;
  bool local_101;
  void *local_100;
  size_t local_f8;
  char *local_f0;
  SourceRange local_e8;
  undefined4 local_d4;
  Type *local_d0;
  bool local_c1;
  void *local_c0;
  type_conflict2 *local_b8;
  type *local_b0;
  ClassType *local_a8;
  undefined1 local_a0;
  ClassType *local_98;
  undefined1 local_90;
  Token local_88;
  ScopedNameSyntax *local_78;
  bool local_69;
  void *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_4c;
  ClassType *local_48;
  bool local_39;
  long *local_38;
  SyntaxNode *local_28;
  undefined8 local_20;
  undefined8 local_18;
  pair<const_slang::ast::ClassType_*,_bool> local_10;
  
  local_39 = false;
  local_48 = (ClassType *)0x0;
  local_38 = in_RDX;
  local_20 = in_RCX;
  if (in_RDI->kind == ConstructorName) {
    local_18 = in_R8;
    if (*in_RDX != 0) {
      bVar1 = Type::isClass((Type *)0x9b9dc2);
      DVar5 = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
      if (bVar1) {
        Type::getCanonicalType(&in_stack_fffffffffffffe50->super_Type);
        local_48 = Symbol::as<slang::ast::ClassType>((Symbol *)0x9b9e8b);
        goto LAB_009ba227;
      }
    }
    DVar5 = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
    if ((*local_38 == 0) || (bVar1 = Type::isError((Type *)0x9b9de8), !bVar1)) {
      local_4c = 0x7b0007;
      local_60 = local_20;
      local_58 = local_18;
      sourceRange.endLoc = in_stack_fffffffffffffe78;
      sourceRange.startLoc = in_stack_fffffffffffffe70;
      ASTContext::addDiag(in_stack_fffffffffffffe68,DVar5,sourceRange);
    }
    local_68 = (void *)0x0;
    local_69 = false;
    std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
              (&local_10,&local_68,&local_69);
    uVar3 = extraout_RDX;
  }
  else {
    local_28 = in_RDI;
    local_78 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(in_RDI);
    not_null<slang::syntax::NameSyntax_*>::operator->
              ((not_null<slang::syntax::NameSyntax_*> *)0x9b9ebe);
    local_88 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffffe80);
    if (local_88.kind == SuperKeyword) {
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x9b9ef3);
      pVar4 = Lookup::getContainingClass(in_stack_fffffffffffffe80);
      DVar5 = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
      local_a8 = pVar4.first;
      local_a0 = pVar4.second;
      local_98 = local_a8;
      local_90 = local_a0;
      local_b0 = std::get<0ul,slang::ast::ClassType_const*,bool>
                           ((pair<const_slang::ast::ClassType_*,_bool> *)0x9b9f35);
      local_b8 = std::get<1ul,slang::ast::ClassType_const*,bool>
                           ((pair<const_slang::ast::ClassType_*,_bool> *)0x9b9f4a);
      local_48 = *local_b0;
      if ((local_48 == (type)0x0) ||
         (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&(local_48->super_Type).super_Symbol.name), bVar1)) {
        local_c0 = (void *)0x0;
        local_c1 = false;
        std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
                  (&local_10,&local_c0,&local_c1);
        uVar3 = extraout_RDX_00;
        goto LAB_009ba3b1;
      }
      local_d0 = ClassType::getBaseClass(in_stack_fffffffffffffe50);
      if (local_d0 == (Type *)0x0) {
        local_d4 = 0x2f000a;
        local_e8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffea0);
        sourceRange_00.endLoc = in_stack_fffffffffffffe78;
        sourceRange_00.startLoc = in_stack_fffffffffffffe70;
        ASTContext::addDiag(in_stack_fffffffffffffe68,DVar5,sourceRange_00);
        local_f8 = (local_48->super_Type).super_Symbol.name._M_len;
        local_f0 = (local_48->super_Type).super_Symbol.name._M_str;
        arg._M_str = (char *)in_stack_fffffffffffffea0;
        arg._M_len = (size_t)in_stack_fffffffffffffe98;
        Diagnostic::operator<<
                  ((Diagnostic *)
                   CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT42(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)))
                   ,arg);
        local_100 = (void *)0x0;
        local_101 = false;
        std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
                  (&local_10,&local_100,&local_101);
        uVar3 = extraout_RDX_01;
        goto LAB_009ba3b1;
      }
      bVar1 = Type::isError((Type *)0x9ba0b4);
      if (bVar1) {
        local_110 = (void *)0x0;
        local_111 = false;
        std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
                  (&local_10,&local_110,&local_111);
        uVar3 = extraout_RDX_02;
        goto LAB_009ba3b1;
      }
      Symbol::as<slang::ast::Type>((Symbol *)0x9ba0fd);
      Type::getCanonicalType(&in_stack_fffffffffffffe50->super_Type);
      local_48 = Symbol::as<slang::ast::ClassType>((Symbol *)0x9ba10d);
      this = ASTContext::getCompilation((ASTContext *)0x9ba122);
      pTVar2 = Compilation::getVoidType(this);
      *local_38 = (long)pTVar2;
      local_39 = true;
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(local_28);
      DVar5 = SUB84((ulong)in_stack_fffffffffffffe80 >> 0x20,0);
      local_120 = not_null<slang::syntax::NameSyntax_*>::operator*
                            ((not_null<slang::syntax::NameSyntax_*> *)0x9ba15e);
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)0x9ba18c);
      local_12c = local_122;
      local_130 = local_126;
      local_48 = Lookup::findClass(in_stack_00000210,in_stack_00000208,
                                   (optional<slang::DiagCode>)in_stack_0000021a);
      if (local_48 == (ClassType *)0x0) {
        local_138 = (void *)0x0;
        local_139 = false;
        std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
                  (&local_10,&local_138,&local_139);
        uVar3 = extraout_RDX_03;
        goto LAB_009ba3b1;
      }
      *local_38 = (long)local_48;
    }
LAB_009ba227:
    if (((local_39 & 1U) == 0) && ((local_48->isAbstract & 1U) != 0)) {
      sourceRange_01.endLoc = in_stack_fffffffffffffe78;
      sourceRange_01.startLoc = in_stack_fffffffffffffe70;
      ASTContext::addDiag(in_stack_fffffffffffffe68,DVar5,sourceRange_01);
      arg_00._M_str = (char *)(local_48->super_Type).super_Symbol.name._M_len;
      arg_00._M_len = (size_t)in_stack_fffffffffffffe98;
      Diagnostic::operator<<
                ((Diagnostic *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT42(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90))),
                 arg_00);
      std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
                (&local_10,(void **)&stack0xfffffffffffffe98,(bool *)&stack0xfffffffffffffe97);
      uVar3 = extraout_RDX_04;
    }
    else if (((local_39 & 1U) == 0) && ((local_48->isInterface & 1U) != 0)) {
      uVar6 = 0x7c0007;
      sourceRange_02.endLoc = in_stack_fffffffffffffe78;
      sourceRange_02.startLoc = in_stack_fffffffffffffe70;
      ASTContext::addDiag(in_stack_fffffffffffffe68,local_20._4_4_,sourceRange_02);
      arg_01._M_str = (char *)in_stack_fffffffffffffea0;
      arg_01._M_len = (size_t)in_stack_fffffffffffffe98;
      Diagnostic::operator<<
                ((Diagnostic *)
                 CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,
                                   CONCAT42(uVar6,in_stack_fffffffffffffe90))),arg_01);
      local_199 = false;
      std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool,_true>
                (&local_10,(void **)&stack0xfffffffffffffe68,&local_199);
      uVar3 = extraout_RDX_05;
    }
    else {
      std::pair<const_slang::ast::ClassType_*,_bool>::
      pair<const_slang::ast::ClassType_*&,_bool_&,_true>(&local_10,&local_48,&local_39);
      uVar3 = extraout_RDX_06;
    }
  }
LAB_009ba3b1:
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10.second;
  pVar4.first = local_10.first;
  return pVar4;
}

Assistant:

static std::pair<const ClassType*, bool> resolveNewClassTarget(const NameSyntax& nameSyntax,
                                                               const ASTContext& context,
                                                               const Type*& assignmentTarget,
                                                               SourceRange range) {
    // If the new expression is typed, look up that type as the target.
    // Otherwise, the target must come from the expression context.
    bool isSuperClass = false;
    const ClassType* classType = nullptr;
    if (nameSyntax.kind == SyntaxKind::ConstructorName) {
        if (!assignmentTarget || !assignmentTarget->isClass()) {
            if (!assignmentTarget || !assignmentTarget->isError())
                context.addDiag(diag::NewClassTarget, range);
            return {nullptr, false};
        }

        classType = &assignmentTarget->getCanonicalType().as<ClassType>();
    }
    else {
        auto& scoped = nameSyntax.as<ScopedNameSyntax>();
        if (scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            // This is a super.new invocation, so find the base class's
            // constructor. This is relative to our current context, not
            // any particular assignment target.
            auto [ct, _] = Lookup::getContainingClass(*context.scope);
            classType = ct;
            if (!classType || classType->name.empty()) {
                // Parser already emitted an error for this case.
                return {nullptr, false};
            }

            auto base = classType->getBaseClass();
            if (!base) {
                context.addDiag(diag::SuperNoBase, nameSyntax.sourceRange()) << classType->name;
                return {nullptr, false};
            }

            if (base->isError())
                return {nullptr, false};

            classType = &base->as<Type>().getCanonicalType().as<ClassType>();
            assignmentTarget = &context.getCompilation().getVoidType();
            isSuperClass = true;
        }
        else {
            auto& className = *nameSyntax.as<ScopedNameSyntax>().left;
            classType = Lookup::findClass(className, context);
            if (!classType)
                return {nullptr, false};

            assignmentTarget = classType;
        }
    }

    if (!isSuperClass && classType->isAbstract) {
        context.addDiag(diag::NewVirtualClass, range) << classType->name;
        return {nullptr, false};
    }

    if (!isSuperClass && classType->isInterface) {
        context.addDiag(diag::NewInterfaceClass, range) << classType->name;
        return {nullptr, false};
    }

    return {classType, isSuperClass};
}